

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.cc
# Opt level: O2

void tvm::contrib::argsort<double,int>(DLTensor *input,DLTensor *output,int32_t axis,bool is_ascend)

{
  void *pvVar1;
  void *pvVar2;
  pointer ppVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  undefined4 *puVar9;
  code *__comp;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  double *pdVar15;
  bool bVar16;
  long local_b0;
  vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> sorter;
  pair<long,_double> local_40;
  
  pvVar1 = input->data;
  pvVar2 = output->data;
  sorter.super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sorter.super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sorter.super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar14 = (long)axis;
  uVar6 = 0;
  uVar11 = (ulong)(uint)input->ndim;
  if (input->ndim < 1) {
    uVar11 = uVar6;
  }
  uVar10 = 1;
  uVar12 = 1;
  while( true ) {
    if (uVar11 == uVar6) break;
    if ((long)uVar6 < lVar14) {
      uVar12 = (ulong)(uint)((int)uVar12 * (int)input->shape[uVar6]);
    }
    else if (lVar14 < (long)uVar6) {
      uVar10 = uVar10 * (int)input->shape[uVar6];
    }
    uVar6 = uVar6 + 1;
  }
  lVar7 = (long)(int)uVar10;
  uVar11 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar11 = 0;
  }
  if ((int)uVar12 < 1) {
    uVar12 = 0;
  }
  __comp = CompareDescend<double>;
  if (is_ascend) {
    __comp = CompareAscend<double>;
  }
  local_b0 = 0;
  ppVar3 = (pointer)0x0;
  for (uVar6 = 0; uVar6 != uVar12; uVar6 = uVar6 + 1) {
    for (uVar5 = 0; uVar5 != uVar11; uVar5 = uVar5 + 1) {
      if (sorter.
          super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppVar3) {
        sorter.
        super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = ppVar3;
      }
      lVar4 = input->shape[lVar14];
      lVar8 = local_b0 * lVar4 + uVar5;
      pdVar15 = (double *)((long)pvVar1 + lVar8 * 8);
      for (lVar13 = 0; lVar13 < lVar4; lVar13 = lVar13 + 1) {
        local_40.second = *pdVar15;
        local_40.first = lVar13;
        std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>::
        emplace_back<std::pair<long,double>>
                  ((vector<std::pair<long,double>,std::allocator<std::pair<long,double>>> *)&sorter,
                   &local_40);
        lVar4 = input->shape[lVar14];
        pdVar15 = pdVar15 + lVar7;
      }
      std::
      __stable_sort<__gnu_cxx::__normal_iterator<std::pair<long,double>*,std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<long,double>const&,std::pair<long,double>const&)>>
                ((__normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
                  )sorter.
                   super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
                  )sorter.
                   super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                 (_Iter_comp_iter<bool_(*)(const_std::pair<long,_double>_&,_const_std::pair<long,_double>_&)>
                  )__comp);
      lVar4 = input->shape[lVar14];
      if (lVar4 < 1) {
        lVar4 = 0;
      }
      puVar9 = (undefined4 *)((long)pvVar2 + lVar8 * 4);
      ppVar3 = sorter.
               super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      while (bVar16 = lVar4 != 0, lVar4 = lVar4 + -1, bVar16) {
        *puVar9 = (int)ppVar3->first;
        ppVar3 = ppVar3 + 1;
        puVar9 = puVar9 + lVar7;
      }
      ppVar3 = sorter.
               super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    local_b0 = local_b0 + lVar7;
  }
  std::_Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>::
  ~_Vector_base(&sorter.
                 super__Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>
               );
  return;
}

Assistant:

void argsort(DLTensor *input, DLTensor *output, int32_t axis, bool is_ascend) {
  auto data_ptr = static_cast<DataType *>(input->data);
  auto out_ptr = static_cast<OutType *>(output->data);
  std::vector<std::pair<int64_t, DataType>> sorter;

  int axis_mul_before = 1;
  int axis_mul_after = 1;
  for (int i = 0; i < input->ndim; ++i) {
    if (i < axis) {
      axis_mul_before *= input->shape[i];
    } else if (i > axis) {
      axis_mul_after *= input->shape[i];
    }
  }

  for (int i = 0; i < axis_mul_before; ++i) {
    for (int j = 0; j < axis_mul_after; ++j) {
      sorter.clear();
      int64_t base_idx = i * input->shape[axis] * axis_mul_after + j;
      for (int64_t k = 0; k < input->shape[axis]; ++k) {
        int64_t full_idx = base_idx + k * axis_mul_after;
        sorter.emplace_back(std::make_pair(k, data_ptr[full_idx]));
      }
      if (is_ascend) {
        std::stable_sort(sorter.begin(), sorter.end(), CompareAscend<DataType>);
      } else {
        std::stable_sort(sorter.begin(), sorter.end(), CompareDescend<DataType>);
      }
      for (int64_t k = 0; k < input->shape[axis]; ++k) {
        out_ptr[base_idx + k * axis_mul_after] = static_cast<OutType>(sorter[k].first);
      }
    }
  }
}